

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclDevice.cpp
# Opt level: O2

void __thiscall xmrig::OclDevice::toJSON(OclDevice *this,Value *out,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *doc_00;
  String local_a0;
  undefined1 local_90 [24];
  undefined4 local_78;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  allocator = doc->allocator_;
  local_40.s = "board";
  local_40.length = 5;
  doc_00 = (Document *)&this->m_board;
  if ((this->m_board).m_data == (char *)0x0) {
    doc_00 = (Document *)&this->m_name;
  }
  String::toJSON(&local_a0,doc_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,&local_40,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a0,allocator);
  local_50.s = "name";
  local_50.length = 4;
  String::toJSON(&local_a0,(Document *)&this->m_name);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,&local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a0,allocator);
  local_90._16_8_ = "bus_id";
  local_78 = 6;
  PciTopology::toString((PciTopology *)local_90);
  String::toJSON(&local_a0,(Document *)local_90);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(out,(StringRefType *)(local_90 + 0x10),
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_a0,allocator);
  String::~String((String *)local_90);
  local_60.s = "cu";
  local_60.length = 2;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>(out,&local_60,this->m_computeUnits,allocator);
  local_70.s = "global_mem";
  local_70.length = 10;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>(out,&local_70,this->m_globalMemory,allocator);
  return;
}

Assistant:

void xmrig::OclDevice::toJSON(rapidjson::Value &out, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    out.AddMember("board",       board().toJSON(doc), allocator);
    out.AddMember("name",        name().toJSON(doc), allocator);
    out.AddMember("bus_id",      topology().toString().toJSON(doc), allocator);
    out.AddMember("cu",          computeUnits(), allocator);
    out.AddMember("global_mem",  static_cast<uint64_t>(globalMemSize()), allocator);
}